

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::LatchVisitor::check_sequential(SequentialStmtBlock *stmt)

{
  __node_base_ptr *this;
  Port *this_00;
  bool bVar1;
  VarType VVar2;
  PortType PVar3;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *this_01;
  reference pEVar4;
  unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
  *puVar5;
  reference ppIVar6;
  __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  IRNode *root;
  unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
  *puVar8;
  reference __in;
  type *ppVVar9;
  type *stmts_00;
  StmtBlock *stmt_00;
  type *stmts;
  type *v;
  _Node_iterator_base<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_false>
  local_208;
  iterator __end4;
  iterator __begin4;
  unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
  *__range4;
  unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
  vars;
  AssignedVarVisitor a_v;
  IfStmt **if_;
  iterator __end3;
  iterator __begin3;
  unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
  *__range3;
  unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
  ifs;
  undefined1 local_d0 [8];
  IfVisitor visitor;
  Port *port;
  Var *var;
  EventControl *iter;
  const_iterator __end2;
  const_iterator __begin2;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *__range2;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *conditions;
  SequentialStmtBlock *stmt_local;
  
  this_01 = SequentialStmtBlock::get_event_controls(stmt);
  __end2 = std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::begin(this_01);
  iter = (EventControl *)
         std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
                                     *)&iter), bVar1) {
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
             ::operator*(&__end2);
    this_00 = (Port *)pEVar4->var;
    VVar2 = Var::type((Var *)this_00);
    if ((VVar2 != PortIO) ||
       (visitor.ifs_._M_h._M_single_bucket = (__node_base_ptr)this_00,
       PVar3 = Port::port_type(this_00), PVar3 != Clock)) {
      IfVisitor::IfVisitor((IfVisitor *)local_d0,(Var *)this_00);
      IRVisitor::visit_root((IRVisitor *)local_d0,(IRNode *)stmt);
      puVar5 = IfVisitor::ifs((IfVisitor *)local_d0);
      std::
      unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
      ::unordered_set((unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
                       *)&__range3,puVar5);
      __end3 = std::
               unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
               ::begin((unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
                        *)&__range3);
      if_ = (IfStmt **)
            std::
            unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
            ::end((unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
                   *)&__range3);
      while (bVar1 = std::__detail::operator!=
                               (&__end3.super__Node_iterator_base<kratos::IfStmt_*,_false>,
                                (_Node_iterator_base<kratos::IfStmt_*,_false> *)&if_), bVar1) {
        ppIVar6 = std::__detail::_Node_iterator<kratos::IfStmt_*,_true,_false>::operator*(&__end3);
        this = &vars._M_h._M_single_bucket;
        AssignedVarVisitor::AssignedVarVisitor((AssignedVarVisitor *)this);
        p_Var7 = &IfStmt::then_body(*ppIVar6)->
                  super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
        root = (IRNode *)
               std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get(p_Var7);
        IRVisitor::visit_root((IRVisitor *)this,root);
        puVar8 = AssignedVarVisitor::assigned_vars
                           ((AssignedVarVisitor *)&vars._M_h._M_single_bucket);
        std::
        unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
        ::unordered_map((unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
                         *)&__range4,puVar8);
        __end4 = std::
                 unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
                 ::begin((unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
                          *)&__range4);
        local_208._M_cur =
             (__node_type *)
             std::
             unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
             ::end((unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
                    *)&__range4);
        while (bVar1 = std::__detail::operator!=
                                 (&__end4.
                                   super__Node_iterator_base<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_false>
                                  ,&local_208), bVar1) {
          __in = std::__detail::
                 _Node_iterator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_false,_false>
                 ::operator*(&__end4);
          ppVVar9 = std::
                    get<0ul,kratos::Var*const,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
                              (__in);
          stmts_00 = std::
                     get<1ul,kratos::Var*const,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
                               (__in);
          p_Var7 = &IfStmt::else_body(*ppIVar6)->
                    super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
          stmt_00 = &std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                               (p_Var7)->super_StmtBlock;
          check_stmt_block(stmt_00,*ppVVar9,stmts_00,false);
          std::__detail::
          _Node_iterator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_false,_false>
          ::operator++(&__end4);
        }
        std::
        unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
        ::~unordered_map((unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
                          *)&__range4);
        AssignedVarVisitor::~AssignedVarVisitor((AssignedVarVisitor *)&vars._M_h._M_single_bucket);
        std::__detail::_Node_iterator<kratos::IfStmt_*,_true,_false>::operator++(&__end3);
      }
      std::
      unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
      ::~unordered_set((unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
                        *)&__range3);
      IfVisitor::~IfVisitor((IfVisitor *)local_d0);
    }
    __gnu_cxx::
    __normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void static check_sequential(SequentialStmtBlock* stmt) {
        auto const& conditions = stmt->get_event_controls();
        // we care about non-clock
        for (auto const& iter : conditions) {
            auto* var = iter.var;
            if (var->type() == VarType::PortIO) {
                auto* port = reinterpret_cast<Port*>(var);
                if (port->port_type() == PortType::Clock) continue;
            }
            // check every if statement that's targeted by that variable
            IfVisitor visitor(var);
            visitor.visit_root(stmt);
            auto ifs = visitor.ifs();
            // derive the variables to check
            for (auto const& if_ : ifs) {
                AssignedVarVisitor a_v;
                a_v.visit_root(if_->then_body().get());
                auto vars = a_v.assigned_vars();
                for (auto const& [v, stmts] : vars) {
                    check_stmt_block(if_->else_body().get(), v, stmts, false);
                }
            }
        }
    }